

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O1

void __thiscall icu_63::RBBIRuleScanner::nextChar(RBBIRuleScanner *this,RBBIRuleChar *c)

{
  RBBIRuleBuilder *pRVar1;
  UErrorCode *pUVar2;
  UParseError *pUVar3;
  UChar32 UVar4;
  int iVar5;
  int32_t i;
  int iVar6;
  bool bVar7;
  
  this->fScanIndex = this->fNextIndex;
  UVar4 = nextCharLL(this);
  c->fChar = UVar4;
  c->fEscaped = '\0';
  if (UVar4 == 0x27) {
    UVar4 = UnicodeString::char32At(this->fRB->fRules,this->fNextIndex);
    if (UVar4 != 0x27) {
      bVar7 = this->fQuoteMode == '\0';
      this->fQuoteMode = bVar7;
      c->fChar = bVar7 ^ 0x29;
      c->fEscaped = '\0';
      return;
    }
    UVar4 = nextCharLL(this);
    c->fChar = UVar4;
    c->fEscaped = '\x01';
  }
  if (this->fQuoteMode == '\0') {
    if (c->fChar == 0x23) {
      iVar6 = this->fScanIndex;
      do {
        UVar4 = nextCharLL(this);
        c->fChar = UVar4;
        if (((UVar4 + 1U < 0xf) && ((0x4801U >> (UVar4 + 1U & 0x1f) & 1) != 0)) || (UVar4 == 0x2028)
           ) break;
      } while (UVar4 != 0x85);
      iVar5 = this->fNextIndex;
      for (; iVar6 < iVar5 + -1; iVar6 = iVar6 + 1) {
        UnicodeString::setCharAt(&this->fRB->fStrippedRules,iVar6,L' ');
        iVar5 = this->fNextIndex;
      }
    }
    if (c->fChar == 0x5c) {
      c->fEscaped = '\x01';
      iVar6 = this->fNextIndex;
      UVar4 = UnicodeString::unescapeAt(this->fRB->fRules,&this->fNextIndex);
      c->fChar = UVar4;
      iVar6 = this->fNextIndex - iVar6;
      if (iVar6 == 0) {
        pRVar1 = this->fRB;
        pUVar2 = pRVar1->fStatus;
        if (*pUVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
          *pUVar2 = U_BRK_HEX_DIGITS_EXPECTED;
          pUVar3 = pRVar1->fParseError;
          if (pUVar3 != (UParseError *)0x0) {
            pUVar3->line = this->fLineNum;
            pUVar3->offset = this->fCharNum;
            pUVar3->preContext[0] = L'\0';
            pUVar3->postContext[0] = L'\0';
          }
        }
      }
      this->fCharNum = this->fCharNum + iVar6;
    }
  }
  else {
    c->fEscaped = '\x01';
  }
  return;
}

Assistant:

void RBBIRuleScanner::nextChar(RBBIRuleChar &c) {

    // Unicode Character constants needed for the processing done by nextChar(),
    //   in hex because literals wont work on EBCDIC machines.

    fScanIndex = fNextIndex;
    c.fChar    = nextCharLL();
    c.fEscaped = FALSE;

    //
    //  check for '' sequence.
    //  These are recognized in all contexts, whether in quoted text or not.
    //
    if (c.fChar == chApos) {
        if (fRB->fRules.char32At(fNextIndex) == chApos) {
            c.fChar    = nextCharLL();        // get nextChar officially so character counts
            c.fEscaped = TRUE;                //   stay correct.
        }
        else
        {
            // Single quote, by itself.
            //   Toggle quoting mode.
            //   Return either '('  or ')', because quotes cause a grouping of the quoted text.
            fQuoteMode = !fQuoteMode;
            if (fQuoteMode == TRUE) {
                c.fChar = chLParen;
            } else {
                c.fChar = chRParen;
            }
            c.fEscaped = FALSE;      // The paren that we return is not escaped.
            return;
        }
    }

    if (fQuoteMode) {
        c.fEscaped = TRUE;
    }
    else
    {
        // We are not in a 'quoted region' of the source.
        //
        if (c.fChar == chPound) {
            // Start of a comment.  Consume the rest of it.
            //  The new-line char that terminates the comment is always returned.
            //  It will be treated as white-space, and serves to break up anything
            //    that might otherwise incorrectly clump together with a comment in
            //    the middle (a variable name, for example.)
            int32_t commentStart = fScanIndex;
            for (;;) {
                c.fChar = nextCharLL();
                if (c.fChar == (UChar32)-1 ||  // EOF
                    c.fChar == chCR     ||
                    c.fChar == chLF     ||
                    c.fChar == chNEL    ||
                    c.fChar == chLS)       {break;}
            }
            for (int32_t i=commentStart; i<fNextIndex-1; ++i) {
                fRB->fStrippedRules.setCharAt(i, u' ');
            }
        }
        if (c.fChar == (UChar32)-1) {
            return;
        }

        //
        //  check for backslash escaped characters.
        //  Use UnicodeString::unescapeAt() to handle them.
        //
        if (c.fChar == chBackSlash) {
            c.fEscaped = TRUE;
            int32_t startX = fNextIndex;
            c.fChar = fRB->fRules.unescapeAt(fNextIndex);
            if (fNextIndex == startX) {
                error(U_BRK_HEX_DIGITS_EXPECTED);
            }
            fCharNum += fNextIndex-startX;
        }
    }
    // putc(c.fChar, stdout);
}